

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void jcopy_markers_setup(j_decompress_ptr srcinfo,JCOPY_OPTION option)

{
  int marker_code;
  
  if ((option & ~JCOPYOPT_ICC) != JCOPYOPT_NONE) {
    jpeg_save_markers(srcinfo,0xfe,0xffff);
  }
  if ((option & ~JCOPYOPT_COMMENTS) == JCOPYOPT_ALL) {
    marker_code = 0xe0;
    do {
      if (marker_code != 0xe2 || option != JCOPYOPT_ALL_EXCEPT_ICC) {
        jpeg_save_markers(srcinfo,marker_code,0xffff);
      }
      marker_code = marker_code + 1;
    } while (marker_code != 0xf0);
  }
  if (option == JCOPYOPT_ICC) {
    jpeg_save_markers(srcinfo,0xe2,0xffff);
    return;
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_markers_setup(j_decompress_ptr srcinfo, JCOPY_OPTION option)
{
#ifdef SAVE_MARKERS_SUPPORTED
  int m;

  /* Save comments except under NONE option */
  if (option != JCOPYOPT_NONE && option != JCOPYOPT_ICC) {
    jpeg_save_markers(srcinfo, JPEG_COM, 0xFFFF);
  }
  /* Save all types of APPn markers iff ALL option */
  if (option == JCOPYOPT_ALL || option == JCOPYOPT_ALL_EXCEPT_ICC) {
    for (m = 0; m < 16; m++) {
      if (option == JCOPYOPT_ALL_EXCEPT_ICC && m == 2)
        continue;
      jpeg_save_markers(srcinfo, JPEG_APP0 + m, 0xFFFF);
    }
  }
  /* Save only APP2 markers if ICC option selected */
  if (option == JCOPYOPT_ICC) {
    jpeg_save_markers(srcinfo, JPEG_APP0 + 2, 0xFFFF);
  }
#endif /* SAVE_MARKERS_SUPPORTED */
}